

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_generated_core_validation.cpp
# Opt level: O0

XrResult GenValidUsageInputsXrSetInputDeviceLocationEXT
                   (XrSession session,XrPath topLevelPath,XrPath inputSourcePath,XrSpace space,
                   XrPosef pose)

{
  GenValidUsageXrInstanceInfo *pGVar1;
  bool bVar2;
  ValidateXrHandleResult VVar3;
  uint64_t handle1;
  uint64_t handle2;
  ostream *poVar4;
  pair<GenValidUsageXrHandleInfo_*,_GenValidUsageXrInstanceInfo_*> pVar5;
  string local_718 [32];
  vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> local_6f8;
  allocator local_6d9;
  string local_6d8 [39];
  allocator local_6b1;
  string local_6b0 [32];
  XrSpace_T local_690 [32];
  XrSession_T local_670 [32];
  ostringstream local_650 [8];
  ostringstream oss_error;
  string local_4d8 [32];
  vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> local_4b8;
  allocator local_499;
  string local_498 [39];
  allocator local_471;
  string local_470 [32];
  XrSpace_T local_450 [32];
  ostringstream local_430 [8];
  ostringstream oss_1;
  XrObjectType local_2b4;
  ValidateXrHandleResult handle_result_1;
  GenValidUsageXrInstanceInfo *gen_instance_info;
  GenValidUsageXrHandleInfo *gen_session_info;
  pair<GenValidUsageXrHandleInfo_*,_GenValidUsageXrInstanceInfo_*> info_with_instance;
  string local_288 [32];
  vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> local_268;
  allocator local_249;
  string local_248 [39];
  allocator local_221;
  string local_220 [32];
  XrSession_T local_200 [32];
  ostringstream local_1e0 [8];
  ostringstream oss;
  ValidateXrHandleResult handle_result;
  XrObjectType local_54;
  undefined1 local_50 [8];
  vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> objects_info;
  XrSpace pXStack_30;
  XrResult xr_result;
  XrSpace space_local;
  XrPath inputSourcePath_local;
  XrPath topLevelPath_local;
  XrSession session_local;
  
  objects_info.
  super__Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage._4_4_ = XR_SUCCESS;
  pXStack_30 = space;
  space_local = (XrSpace)inputSourcePath;
  inputSourcePath_local = topLevelPath;
  topLevelPath_local = (XrPath)session;
  std::vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>::vector
            ((vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> *)
             local_50);
  local_54 = XR_OBJECT_TYPE_SESSION;
  std::vector<GenValidUsageXrObjectInfo,std::allocator<GenValidUsageXrObjectInfo>>::
  emplace_back<XrSession_T*&,XrObjectType>
            ((vector<GenValidUsageXrObjectInfo,std::allocator<GenValidUsageXrObjectInfo>> *)local_50
             ,(XrSession_T **)&topLevelPath_local,&local_54);
  VVar3 = VerifyXrSessionHandle((XrSession *)&topLevelPath_local);
  if (VVar3 == VALIDATE_XR_HANDLE_SUCCESS) {
    pVar5 = HandleInfo<XrSession_T_*>::getWithInstanceInfo
                      (&g_session_info,(XrSession_T *)topLevelPath_local);
    _handle_result_1 = pVar5.second;
    gen_instance_info = (GenValidUsageXrInstanceInfo *)pVar5.first;
    local_2b4 = XR_OBJECT_TYPE_SPACE;
    gen_session_info = (GenValidUsageXrHandleInfo *)gen_instance_info;
    info_with_instance.first = (GenValidUsageXrHandleInfo *)_handle_result_1;
    std::vector<GenValidUsageXrObjectInfo,std::allocator<GenValidUsageXrObjectInfo>>::
    emplace_back<XrSpace_T*&,XrObjectType>
              ((vector<GenValidUsageXrObjectInfo,std::allocator<GenValidUsageXrObjectInfo>> *)
               local_50,&stack0xffffffffffffffd0,&local_2b4);
    VVar3 = VerifyXrSpaceHandle(&stack0xffffffffffffffd0);
    if (VVar3 == VALIDATE_XR_HANDLE_SUCCESS) {
      handle1 = MakeHandleGeneric<XrSession_T*>((XrSession_T *)topLevelPath_local);
      handle2 = MakeHandleGeneric<XrSpace_T*>(pXStack_30);
      bVar2 = VerifyXrParent(XR_OBJECT_TYPE_SESSION,handle1,XR_OBJECT_TYPE_SPACE,handle2,true);
      if (bVar2) {
        session_local._4_4_ =
             objects_info.
             super__Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>
             ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_;
        info_with_instance.second._4_4_ = 1;
      }
      else {
        std::__cxx11::ostringstream::ostringstream(local_650);
        poVar4 = std::operator<<((ostream *)local_650,"XrSession ");
        HandleToHexString<XrSession_T*>(local_670);
        std::operator<<(poVar4,(string *)local_670);
        std::__cxx11::string::~string((string *)local_670);
        std::operator<<((ostream *)local_650," must be a parent to XrSpace ");
        HandleToHexString<XrSpace_T*>(local_690);
        std::operator<<((ostream *)local_650,(string *)local_690);
        std::__cxx11::string::~string((string *)local_690);
        pGVar1 = _handle_result_1;
        std::allocator<char>::allocator();
        std::__cxx11::string::string
                  (local_6b0,"VUID-xrSetInputDeviceLocationEXT-space-parent",&local_6b1);
        std::allocator<char>::allocator();
        std::__cxx11::string::string(local_6d8,"xrSetInputDeviceLocationEXT",&local_6d9);
        std::vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>::vector
                  (&local_6f8,
                   (vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> *)
                   local_50);
        std::__cxx11::ostringstream::str();
        CoreValidLogMessage(pGVar1,(string *)local_6b0,VALID_USAGE_DEBUG_SEVERITY_ERROR,
                            (string *)local_6d8,&local_6f8,local_718);
        std::__cxx11::string::~string((string *)local_718);
        std::vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>::~vector
                  (&local_6f8);
        std::__cxx11::string::~string(local_6d8);
        std::allocator<char>::~allocator((allocator<char> *)&local_6d9);
        std::__cxx11::string::~string(local_6b0);
        std::allocator<char>::~allocator((allocator<char> *)&local_6b1);
        session_local._4_4_ = XR_ERROR_VALIDATION_FAILURE;
        info_with_instance.second._4_4_ = 1;
        std::__cxx11::ostringstream::~ostringstream(local_650);
      }
    }
    else {
      std::__cxx11::ostringstream::ostringstream(local_430);
      std::operator<<((ostream *)local_430,"Invalid XrSpace handle \"space\" ");
      HandleToHexString<XrSpace_T*>(local_450);
      std::operator<<((ostream *)local_430,(string *)local_450);
      std::__cxx11::string::~string((string *)local_450);
      pGVar1 = _handle_result_1;
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                (local_470,"VUID-xrSetInputDeviceLocationEXT-space-parameter",&local_471);
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_498,"xrSetInputDeviceLocationEXT",&local_499);
      std::vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>::vector
                (&local_4b8,
                 (vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> *)
                 local_50);
      std::__cxx11::ostringstream::str();
      CoreValidLogMessage(pGVar1,(string *)local_470,VALID_USAGE_DEBUG_SEVERITY_ERROR,
                          (string *)local_498,&local_4b8,local_4d8);
      std::__cxx11::string::~string((string *)local_4d8);
      std::vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>::~vector
                (&local_4b8);
      std::__cxx11::string::~string(local_498);
      std::allocator<char>::~allocator((allocator<char> *)&local_499);
      std::__cxx11::string::~string(local_470);
      std::allocator<char>::~allocator((allocator<char> *)&local_471);
      session_local._4_4_ = XR_ERROR_HANDLE_INVALID;
      info_with_instance.second._4_4_ = 1;
      std::__cxx11::ostringstream::~ostringstream(local_430);
    }
  }
  else {
    std::__cxx11::ostringstream::ostringstream(local_1e0);
    std::operator<<((ostream *)local_1e0,"Invalid XrSession handle \"session\" ");
    HandleToHexString<XrSession_T*>(local_200);
    std::operator<<((ostream *)local_1e0,(string *)local_200);
    std::__cxx11::string::~string((string *)local_200);
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              (local_220,"VUID-xrSetInputDeviceLocationEXT-session-parameter",&local_221);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_248,"xrSetInputDeviceLocationEXT",&local_249);
    std::vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>::vector
              (&local_268,
               (vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> *)
               local_50);
    std::__cxx11::ostringstream::str();
    CoreValidLogMessage((GenValidUsageXrInstanceInfo *)0x0,(string *)local_220,
                        VALID_USAGE_DEBUG_SEVERITY_ERROR,(string *)local_248,&local_268,local_288);
    std::__cxx11::string::~string((string *)local_288);
    std::vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>::~vector
              (&local_268);
    std::__cxx11::string::~string(local_248);
    std::allocator<char>::~allocator((allocator<char> *)&local_249);
    std::__cxx11::string::~string(local_220);
    std::allocator<char>::~allocator((allocator<char> *)&local_221);
    session_local._4_4_ = XR_ERROR_HANDLE_INVALID;
    info_with_instance.second._4_4_ = 1;
    std::__cxx11::ostringstream::~ostringstream(local_1e0);
  }
  std::vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>::~vector
            ((vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> *)
             local_50);
  return session_local._4_4_;
}

Assistant:

XrResult GenValidUsageInputsXrSetInputDeviceLocationEXT(
XrSession session,
XrPath topLevelPath,
XrPath inputSourcePath,
XrSpace space,
XrPosef pose) {
    try {
        XrResult xr_result = XR_SUCCESS;
        std::vector<GenValidUsageXrObjectInfo> objects_info;
        objects_info.emplace_back(session, XR_OBJECT_TYPE_SESSION);

        {
            // writeValidateInlineHandleValidation
            ValidateXrHandleResult handle_result = VerifyXrSessionHandle(&session);
            if (handle_result != VALIDATE_XR_HANDLE_SUCCESS) {
                // Not a valid handle or NULL (which is not valid in this case)
                std::ostringstream oss;
                oss << "Invalid XrSession handle \"session\" ";
                oss << HandleToHexString(session);
                CoreValidLogMessage(nullptr, "VUID-xrSetInputDeviceLocationEXT-session-parameter",
                                    VALID_USAGE_DEBUG_SEVERITY_ERROR, "xrSetInputDeviceLocationEXT",
                                    objects_info, oss.str());
                return XR_ERROR_HANDLE_INVALID;
            }
        }
        auto info_with_instance = g_session_info.getWithInstanceInfo(session);
        GenValidUsageXrHandleInfo *gen_session_info = info_with_instance.first;
        (void)gen_session_info;  // quiet warnings
        GenValidUsageXrInstanceInfo *gen_instance_info = info_with_instance.second;
        (void)gen_instance_info;  // quiet warnings
        objects_info.emplace_back(space, XR_OBJECT_TYPE_SPACE);
        {
            // writeValidateInlineHandleValidation
            ValidateXrHandleResult handle_result = VerifyXrSpaceHandle(&space);
            if (handle_result != VALIDATE_XR_HANDLE_SUCCESS) {
                // Not a valid handle or NULL (which is not valid in this case)
                std::ostringstream oss;
                oss << "Invalid XrSpace handle \"space\" ";
                oss << HandleToHexString(space);
                CoreValidLogMessage(gen_instance_info, "VUID-xrSetInputDeviceLocationEXT-space-parameter",
                                    VALID_USAGE_DEBUG_SEVERITY_ERROR, "xrSetInputDeviceLocationEXT",
                                    objects_info, oss.str());
                return XR_ERROR_HANDLE_INVALID;
            }
        }
        // Verify that the handles share a common ancestry
        if (!VerifyXrParent(XR_OBJECT_TYPE_SESSION,  MakeHandleGeneric(session),
                    XR_OBJECT_TYPE_SPACE,  MakeHandleGeneric(space), true)) {
            std::ostringstream oss_error;
            oss_error << "XrSession " << HandleToHexString(session);
            oss_error << " must be a parent to XrSpace ";
            oss_error << HandleToHexString(space);
            CoreValidLogMessage(gen_instance_info, "VUID-xrSetInputDeviceLocationEXT-space-parent",
                                VALID_USAGE_DEBUG_SEVERITY_ERROR, "xrSetInputDeviceLocationEXT",
                                objects_info, oss_error.str());
            return XR_ERROR_VALIDATION_FAILURE;
        }
        return xr_result;
    } catch (...) {
        return XR_ERROR_VALIDATION_FAILURE;
    }
}